

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_mark.cpp
# Opt level: O0

Read<signed_char> __thiscall
Omega_h::mark_sliver_layers(Omega_h *this,Mesh *mesh,Real qual_ceil,Int nlayers)

{
  void **this_00;
  Omega_h_Parting OVar1;
  void *extraout_RDX;
  Read<signed_char> RVar2;
  Read<signed_char> local_78 [2];
  Read<double> local_58;
  undefined1 local_48 [8];
  Bytes elems_are_slivers;
  Reals quals;
  Int nlayers_local;
  Real qual_ceil_local;
  Mesh *mesh_local;
  
  OVar1 = Mesh::parting(mesh);
  if (OVar1 == OMEGA_H_GHOSTED) {
    this_00 = &elems_are_slivers.write_.shared_alloc_.direct_ptr;
    Mesh::ask_qualities((Mesh *)this_00);
    Read<double>::Read(&local_58,(Read<double> *)this_00);
    each_lt<double>((Omega_h *)local_48,&local_58,qual_ceil);
    Read<double>::~Read(&local_58);
    Read<signed_char>::Read(local_78,(Read<signed_char> *)local_48);
    mark_dual_layers(this,mesh,local_78,nlayers);
    Read<signed_char>::~Read(local_78);
    Read<signed_char>::~Read((Read<signed_char> *)local_48);
    Read<double>::~Read((Read<double> *)&elems_are_slivers.write_.shared_alloc_.direct_ptr);
    RVar2.write_.shared_alloc_.direct_ptr = extraout_RDX;
    RVar2.write_.shared_alloc_.alloc = (Alloc *)this;
    return (Read<signed_char>)RVar2.write_.shared_alloc_;
  }
  fail("assertion %s failed at %s +%d\n","mesh->parting() == OMEGA_H_GHOSTED",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mark.cpp"
       ,0xd0);
}

Assistant:

Read<I8> mark_sliver_layers(Mesh* mesh, Real qual_ceil, Int nlayers) {
  OMEGA_H_CHECK(mesh->parting() == OMEGA_H_GHOSTED);
  auto quals = mesh->ask_qualities();
  auto elems_are_slivers = each_lt(quals, qual_ceil);
  return mark_dual_layers(mesh, elems_are_slivers, nlayers);
}